

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O1

void parseExternalPalSpec(char *arg)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
  *paVar5;
  size_t __n;
  filebuf file;
  char local_110 [240];
  
  pcVar2 = strchr(arg,0x3a);
  if (pcVar2 == (char *)0x0) {
    error("External palette spec must have format `fmt:path` (missing colon)");
    return;
  }
  __n = (long)pcVar2 - (long)arg;
  iVar1 = strncasecmp(arg,"PSP",__n);
  if (iVar1 == 0) {
    paVar5 = &parseExternalPalSpec::parsers;
  }
  else {
    iVar1 = strncasecmp(arg,"GPL",__n);
    if (iVar1 == 0) {
      paVar5 = (array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
                *)0x11ecf8;
    }
    else {
      iVar1 = strncasecmp(arg,"HEX",__n);
      if (iVar1 == 0) {
        paVar5 = (array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
                  *)0x11ed10;
      }
      else {
        iVar1 = strncasecmp(arg,"ACT",__n);
        if (iVar1 == 0) {
          paVar5 = (array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
                    *)0x11ed28;
        }
        else {
          iVar1 = strncasecmp(arg,"ACO",__n);
          if (iVar1 == 0) {
            paVar5 = (array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
                      *)0x11ed40;
          }
          else {
            iVar1 = strncasecmp(arg,"GBC",__n);
            paVar5 = (array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
                      *)_DYNAMIC;
            if (iVar1 == 0) {
              paVar5 = (array<std::tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>,_6UL>
                        *)0x11ed58;
            }
          }
        }
      }
    }
  }
  if ((Elf64_Dyn *)paVar5 == _DYNAMIC) {
    sVar4 = 0x7fffffff;
    if ((long)__n < 0x7fffffff) {
      sVar4 = __n;
    }
    error("Unknown external palette format \"%.*s\"",sVar4,arg);
    return;
  }
  std::filebuf::filebuf(local_110);
  lVar3 = std::filebuf::open(local_110,(_Ios_Openmode)(pcVar2 + 1));
  if (lVar3 == 0) {
    error("Failed to open palette file \"%s\"",pcVar2 + 1);
  }
  else {
    (*(code *)((Elf64_Dyn *)paVar5)->d_val)(local_110);
  }
  std::filebuf::~filebuf(local_110);
  return;
}

Assistant:

void parseExternalPalSpec(char const *arg) {
	// `fmt:path`, parse the file according to the given format

	// Split both parts, error out if malformed
	char const *ptr = strchr(arg, ':');
	if (ptr == nullptr) {
		error("External palette spec must have format `fmt:path` (missing colon)");
		return;
	}
	char const *path = ptr + 1;

	static std::array parsers{
	    std::tuple{"PSP", &parsePSPFile, std::ios::in    },
	    std::tuple{"GPL", &parseGPLFile, std::ios::in    },
	    std::tuple{"HEX", &parseHEXFile, std::ios::in    },
	    std::tuple{"ACT", &parseACTFile, std::ios::binary},
	    std::tuple{"ACO", &parseACOFile, std::ios::binary},
	    std::tuple{"GBC", &parseGBCFile, std::ios::binary},
	};

	auto iter = std::find_if(parsers.begin(), parsers.end(),
	                         [&arg, &ptr](decltype(parsers)::value_type const &parser) {
		                         return strncasecmp(arg, std::get<0>(parser), ptr - arg) == 0;
	                         });
	if (iter == parsers.end()) {
		error("Unknown external palette format \"%.*s\"",
		      static_cast<int>(std::min(ptr - arg, static_cast<decltype(ptr - arg)>(INT_MAX))),
		      arg);
		return;
	}

	std::filebuf file;
	// Some parsers read the file in text mode, others in binary mode
	if (!file.open(path, std::ios::in | std::get<2>(*iter))) {
		error("Failed to open palette file \"%s\"", path);
		return;
	}

	std::get<1> (*iter)(file);
}